

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O2

void __thiscall Fl_Shared_Image::release(Fl_Shared_Image *this)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  
  iVar2 = this->refcount_;
  this->refcount_ = iVar2 + -1;
  if (iVar2 < 2) {
    uVar1 = 0;
    uVar3 = 0;
    if (0 < num_images_) {
      uVar3 = (ulong)(uint)num_images_;
    }
    iVar2 = num_images_ + -1;
    __n = (long)iVar2 << 3;
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      if (images_[uVar1] == this) {
        num_images_ = iVar2;
        if ((int)uVar1 < iVar2) {
          memmove(images_ + uVar1,images_ + uVar1 + 1,__n);
        }
        break;
      }
      __n = __n - 8;
    }
    (*(this->super_Fl_Image)._vptr_Fl_Image[1])(this);
    if (images_ != (Fl_Shared_Image **)0x0 && num_images_ == 0) {
      operator_delete__(images_);
      images_ = (Fl_Shared_Image **)0x0;
      alloc_images_ = 0;
    }
  }
  return;
}

Assistant:

void Fl_Shared_Image::release() {
  int	i;	// Looping var...

  refcount_ --;
  if (refcount_ > 0) return;

  for (i = 0; i < num_images_; i ++)
    if (images_[i] == this) {
      num_images_ --;

      if (i < num_images_) {
        memmove(images_ + i, images_ + i + 1,
               (num_images_ - i) * sizeof(Fl_Shared_Image *));
      }

      break;
    }

  delete this;

  if (num_images_ == 0 && images_) {
    delete[] images_;

    images_       = 0;
    alloc_images_ = 0;
  }
}